

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O3

void osThread::dump_info(ostream *out)

{
  long lVar1;
  osMutex *this;
  osEvent *this_00;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\n\n\"Reading\" means that the thread is reading a device or network socket\n\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------+------------------------------------\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Thread Name         | State\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------+------------------------------------\n",0x3a);
  osMutex::Take(&Mutex,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osThread.cpp"
                ,0x167);
  lVar5 = 0;
  do {
    lVar4 = *(long *)((long)Threads + lVar5);
    if (lVar4 == 0) goto switchD_0010a4c0_default;
    lVar1 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x14;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x20;
    sVar2 = strlen((char *)(lVar4 + 0xe0));
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)(lVar4 + 0xe0),sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
    switch(*(undefined4 *)(lVar4 + 0x10c)) {
    case 0:
      lVar4 = 5;
      pcVar3 = "init\n";
      break;
    case 1:
      lVar4 = 8;
      pcVar3 = "running\n";
      break;
    case 2:
      this = *(osMutex **)(lVar4 + 0x110);
      if (this == (osMutex *)0x0) {
        lVar4 = 0x1b;
        pcVar3 = "pending on mutex \"UNKNOWN\"\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out,"pending on mutex \"",0x12);
        pcVar3 = osMutex::GetName(this);
LAB_0010a592:
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
        }
        else {
          sVar2 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,sVar2);
        }
        lVar4 = 2;
        pcVar3 = "\"\n";
      }
      break;
    case 3:
      this_00 = *(osEvent **)(lVar4 + 0x110);
      if (this_00 != (osEvent *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"pending event \"",0xf);
        pcVar3 = osEvent::GetName(this_00);
        goto LAB_0010a592;
      }
      lVar4 = 0x18;
      pcVar3 = "pending event \"UNKNOWN\"\n";
      break;
    case 4:
      std::__ostream_insert<char,std::char_traits<char>>(out,"sleeping ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(out," at ",4);
      pcVar3 = *(char **)(lVar4 + 0x100);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      else {
        sVar2 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::operator<<(out,*(int *)(lVar4 + 0x108));
    default:
      goto switchD_0010a4c0_default;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,lVar4);
switchD_0010a4c0_default:
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x180) {
      osMutex::Give(&Mutex);
      return;
    }
  } while( true );
}

Assistant:

void osThread::dump_info(std::ostream& out)
{
#ifdef WIN32
    FILETIME creationTime;
    FILETIME exitTime;
    FILETIME kernelTime;
    FILETIME userTime;
    SYSTEMTIME sysTime;
    HANDLE handle;

    handle = GetCurrentProcess();
    out << "Process Priority   = 0x" << to_hex(GetPriorityClass(handle)) << "\n";
    if (GetProcessTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime))
    {
        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << "  Kernel Time      = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << "  User Time        = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";
    }
#endif

    out << "\n\n\"Reading\" means that the thread is reading a device or network socket\n\n";

#ifdef WIN32
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
    out << "Pri |Thread Name         | ID    | Kernel Time  |  User Time   | State\n";
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
#elif __linux__
    out << "--------------------+------------------------------------\n";
    out << "Thread Name         | State\n";
    out << "--------------------+------------------------------------\n";
#endif

    Mutex.Take(__FILE__, __LINE__);

    for (int i = 0; i < MAX_THREADS; i++)
    {
        osThread* thread = Threads[i];
        if (!thread)
        {
            continue;
        }
#ifdef WIN32
        handle = thread->GetHandle();

        int priority;
        if (handle)
        {
            priority = GetThreadPriority(handle);
        }
        else
        {
            priority = -1;
        }
        GetThreadTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime);

        out << std::setw(3) << priority << " |";
        out << std::setw(20) << std::left << thread->Name << "|";
        out << std::setw(6) << handle << " | ";

        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

#elif __linux__
        out << std::setw(20) << std::left << thread->Name << "|";
#endif

        // Find out what this thread is doing
        switch (thread->State)
        {
        case INIT: out << "init\n"; break;
        case RUNNING: out << "running\n"; break;
        case PENDING_MUTEX:
        {
            osMutex* obj = (osMutex*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending on mutex \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending on mutex \"UNKNOWN\"\n";
            }
            break;
        }
        case PENDING_EVENT:
        {
            osEvent* obj = (osEvent*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending event \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending event \"UNKNOWN\"\n";
            }
            break;
        }
        case SLEEPING:
            out << "sleeping " << thread->USleepTime;
            out << " at " << thread->Filename << " " << thread->Linenumber;
            break;
        }
    }

    Mutex.Give();
}